

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

LY_ERR lyplg_type_check_hints
                 (uint32_t hints,char *value,size_t value_len,LY_DATA_TYPE type,int *base,
                 ly_err_item **err)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  undefined4 uVar4;
  ly_err_item **err_local;
  int *base_local;
  LY_DATA_TYPE type_local;
  size_t value_len_local;
  char *value_local;
  uint32_t hints_local;
  
  if ((value == (char *)0x0) && (value_len != 0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","value || !value_len",
           "lyplg_type_check_hints");
    value_local._4_4_ = LY_EINVAL;
  }
  else if (err == (ly_err_item **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","err",
           "lyplg_type_check_hints");
    value_local._4_4_ = LY_EINVAL;
  }
  else {
    *err = (ly_err_item *)0x0;
    value_len_local = (size_t)value;
    if (value == (char *)0x0) {
      value_len_local = (long)"\t" + 1;
    }
    uVar4 = (undefined4)value_len;
    switch(type) {
    case LY_TYPE_UNKNOWN:
    case LY_TYPE_LEAFREF:
    case LY_TYPE_UNION:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types.c"
             ,0x2db);
      return LY_EINT;
    case LY_TYPE_BINARY:
    case LY_TYPE_STRING:
    case LY_TYPE_BITS:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
      if ((hints & 1) == 0) {
        pcVar3 = lys_datatype2str(type);
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Invalid non-string-encoded %s value \"%.*s\".",pcVar3,uVar4,
                           value_len_local);
        return LVar1;
      }
      break;
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
      if (base == (int *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","base",
               "lyplg_type_check_hints");
        return LY_EINVAL;
      }
      if ((hints & 0xe) == 0) {
        pcVar3 = lys_datatype2str(type);
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Invalid non-number-encoded %s value \"%.*s\".",pcVar3,uVar4,
                           value_len_local);
        return LVar1;
      }
      iVar2 = type_get_hints_base(hints);
      *base = iVar2;
      break;
    case LY_TYPE_UINT64:
    case LY_TYPE_INT64:
      if (base == (int *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","base",
               "lyplg_type_check_hints");
        return LY_EINVAL;
      }
      if ((hints & 0x10) == 0) {
        pcVar3 = lys_datatype2str(type);
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Invalid non-num64-encoded %s value \"%.*s\".",pcVar3,uVar4,
                           value_len_local);
        return LVar1;
      }
      iVar2 = type_get_hints_base(hints);
      *base = iVar2;
      break;
    case LY_TYPE_BOOL:
      if ((hints & 0x20) == 0) {
        pcVar3 = lys_datatype2str(type);
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Invalid non-boolean-encoded %s value \"%.*s\".",pcVar3,uVar4,
                           value_len_local);
        return LVar1;
      }
      break;
    case LY_TYPE_EMPTY:
      if ((hints & 0x40) == 0) {
        pcVar3 = lys_datatype2str(type);
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Invalid non-empty-encoded %s value \"%.*s\".",pcVar3,uVar4,
                           value_len_local);
        return LVar1;
      }
    }
    value_local._4_4_ = LY_SUCCESS;
  }
  return value_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_check_hints(uint32_t hints, const char *value, size_t value_len, LY_DATA_TYPE type, int *base,
        struct ly_err_item **err)
{
    LY_CHECK_ARG_RET(NULL, value || !value_len, err, LY_EINVAL);

    *err = NULL;
    if (!value) {
        value = "";
    }

    switch (type) {
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
        LY_CHECK_ARG_RET(NULL, base, LY_EINVAL);

        if (!(hints & (LYD_VALHINT_DECNUM | LYD_VALHINT_OCTNUM | LYD_VALHINT_HEXNUM))) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-number-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        *base = type_get_hints_base(hints);
        break;
    case LY_TYPE_UINT64:
    case LY_TYPE_INT64:
        LY_CHECK_ARG_RET(NULL, base, LY_EINVAL);

        if (!(hints & LYD_VALHINT_NUM64)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-num64-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        *base = type_get_hints_base(hints);
        break;
    case LY_TYPE_STRING:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_BITS:
    case LY_TYPE_BINARY:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
        if (!(hints & LYD_VALHINT_STRING)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-string-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_BOOL:
        if (!(hints & LYD_VALHINT_BOOLEAN)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-boolean-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_EMPTY:
        if (!(hints & LYD_VALHINT_EMPTY)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-empty-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_UNKNOWN:
    case LY_TYPE_LEAFREF:
    case LY_TYPE_UNION:
        LOGINT_RET(NULL);
    }

    return LY_SUCCESS;
}